

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_deep_copy(REF_GEOM *ref_geom_ptr,REF_GEOM original)

{
  int iVar1;
  uint uVar2;
  REF_GEOM ref_geom_recipient;
  REF_INT *pRVar3;
  REF_DBL *pRVar4;
  long lVar5;
  REF_INT *pRVar6;
  REF_DBL *pRVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  
  *ref_geom_ptr = (REF_GEOM)0x0;
  ref_geom_recipient = (REF_GEOM)malloc(0xf0);
  *ref_geom_ptr = ref_geom_recipient;
  if (ref_geom_recipient == (REF_GEOM)0x0) {
    pcVar11 = "malloc *ref_geom_ptr of REF_GEOM_STRUCT NULL";
    uVar8 = 0x8a;
  }
  else {
    ref_geom_recipient->n = original->n;
    uVar2 = original->max;
    ref_geom_recipient->max = uVar2;
    if ((int)uVar2 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x92,
             "ref_geom_deep_copy","malloc ref_geom->descr of REF_INT negative");
      return 1;
    }
    pRVar3 = (REF_INT *)malloc((ulong)uVar2 * 0x18);
    ref_geom_recipient->descr = pRVar3;
    if (pRVar3 == (REF_INT *)0x0) {
      pcVar11 = "malloc ref_geom->descr of REF_INT NULL";
      uVar8 = 0x92;
    }
    else {
      pRVar4 = (REF_DBL *)malloc((ulong)(uVar2 * 2) << 3);
      ref_geom_recipient->param = pRVar4;
      if (pRVar4 != (REF_DBL *)0x0) {
        ref_geom_recipient->face_min_length = (REF_DBL *)0x0;
        ref_geom_recipient->face_seg_per_rad = (REF_DBL *)0x0;
        ref_geom_recipient->uv_area_sign = (REF_DBL *)0x0;
        ref_geom_recipient->initial_cell_height = (REF_DBL *)0x0;
        ref_geom_recipient->segments_per_radian_of_curvature =
             original->segments_per_radian_of_curvature;
        ref_geom_recipient->segments_per_bounding_box_diagonal =
             original->segments_per_bounding_box_diagonal;
        ref_geom_recipient->tolerance_protection = original->tolerance_protection;
        ref_geom_recipient->gap_protection = original->gap_protection;
        iVar1 = ref_geom_recipient->max;
        lVar5 = (long)iVar1;
        if (0 < lVar5) {
          pRVar6 = original->descr;
          lVar9 = 0;
          do {
            lVar10 = 0;
            do {
              pRVar3[lVar10] = pRVar6[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 6);
            lVar9 = lVar9 + 1;
            pRVar3 = pRVar3 + 6;
            pRVar6 = pRVar6 + 6;
          } while (lVar9 != lVar5);
        }
        ref_geom_recipient->blank = original->blank;
        if (0 < iVar1) {
          pRVar7 = original->param;
          lVar9 = 0;
          do {
            lVar10 = 0;
            do {
              pRVar4[lVar10] = pRVar7[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 == 1);
            lVar9 = lVar9 + 1;
            pRVar4 = pRVar4 + 2;
            pRVar7 = pRVar7 + 2;
          } while (lVar9 != lVar5);
        }
        uVar2 = ref_adj_deep_copy(&ref_geom_recipient->ref_adj,original->ref_adj);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xa8,"ref_geom_deep_copy",(ulong)uVar2,"deep copy ref_adj for ref_geom");
          return uVar2;
        }
        ref_geom_recipient->zip_pcurve = original->zip_pcurve;
        ref_geom_recipient->contex_owned = 0;
        uVar2 = ref_geom_share_context(ref_geom_recipient,original);
        if (uVar2 == 0) {
          ref_geom_recipient->meshlink = (void *)0x0;
          ref_geom_recipient->meshlink_projection = (void *)0x0;
          ref_geom_recipient->cad_data_size = 0;
          ref_geom_recipient->cad_data = (REF_BYTE *)0x0;
          ref_geom_recipient->ref_facelift = (REF_FACELIFT)0x0;
          return 0;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xad
               ,"ref_geom_deep_copy",(ulong)uVar2,"share egads");
        return uVar2;
      }
      pcVar11 = "malloc ref_geom->param of REF_DBL NULL";
      uVar8 = 0x93;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar8,
         "ref_geom_deep_copy",pcVar11);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_deep_copy(REF_GEOM *ref_geom_ptr,
                                      REF_GEOM original) {
  REF_GEOM ref_geom;
  REF_INT geom, i;
  (*ref_geom_ptr) = NULL;

  ref_malloc(*ref_geom_ptr, 1, REF_GEOM_STRUCT);

  ref_geom = (*ref_geom_ptr);

  ref_geom_n(ref_geom) = ref_geom_n(original);
  ref_geom_max(ref_geom) = ref_geom_max(original);

  ref_malloc(ref_geom->descr, REF_GEOM_DESCR_SIZE * ref_geom_max(ref_geom),
             REF_INT);
  ref_malloc(ref_geom->param, 2 * ref_geom_max(ref_geom), REF_DBL);
  ref_geom->uv_area_sign = NULL;
  ref_geom->initial_cell_height = NULL;
  ref_geom->face_min_length = NULL;
  ref_geom->face_seg_per_rad = NULL;
  ref_geom->segments_per_radian_of_curvature =
      original->segments_per_radian_of_curvature;
  ref_geom->segments_per_bounding_box_diagonal =
      original->segments_per_bounding_box_diagonal;
  ref_geom->tolerance_protection = original->tolerance_protection;
  ref_geom->gap_protection = original->gap_protection;

  for (geom = 0; geom < ref_geom_max(ref_geom); geom++)
    for (i = 0; i < REF_GEOM_DESCR_SIZE; i++)
      ref_geom_descr(ref_geom, i, geom) = ref_geom_descr(original, i, geom);
  ref_geom_blank(ref_geom) = ref_geom_blank(original);
  for (geom = 0; geom < ref_geom_max(ref_geom); geom++)
    for (i = 0; i < 2; i++)
      ref_geom_param(ref_geom, i, geom) = ref_geom_param(original, i, geom);

  RSS(ref_adj_deep_copy(&(ref_geom->ref_adj), original->ref_adj),
      "deep copy ref_adj for ref_geom");

  ref_geom->zip_pcurve = original->zip_pcurve;

  ref_geom->contex_owned = REF_FALSE;
  RSS(ref_geom_share_context(ref_geom, original), "share egads");

  ref_geom->cad_data_size = 0;
  ref_geom->cad_data = (REF_BYTE *)NULL;

  ref_geom->meshlink = NULL;
  ref_geom->meshlink_projection = NULL;

  ref_geom->ref_facelift = NULL;

  return REF_SUCCESS;
}